

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV SymDecryptFinal(Session *session,CK_BYTE_PTR pDecryptedData,CK_ULONG_PTR pulDecryptedDataLen)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Session *this;
  size_t sVar5;
  uchar *__src;
  ulong *in_RDX;
  void *in_RSI;
  Session *in_RDI;
  ByteString decryptedFinal;
  size_t paddingAdjustByte;
  size_t blockSize;
  CK_ULONG size;
  size_t remainingSize;
  SymmetricAlgorithm *cipher;
  ByteString *this_00;
  Session *in_stack_ffffffffffffff00;
  undefined1 local_70 [40];
  long local_48;
  ulong local_40;
  ByteString *local_38;
  ByteString *local_30;
  SymmetricAlgorithm *local_28;
  ulong *local_20;
  void *local_18;
  Session *local_10;
  CK_RV local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = Session::getSymmetricCryptoOp(in_RDI);
  if ((local_28 == (SymmetricAlgorithm *)0x0) ||
     (bVar2 = Session::getAllowMultiPartOp(local_10), !bVar2)) {
    Session::resetOp(in_stack_ffffffffffffff00);
    local_8 = 0x91;
  }
  else {
    iVar3 = (*local_28->_vptr_SymmetricAlgorithm[0x10])();
    local_38 = (ByteString *)CONCAT44(extraout_var,iVar3);
    local_30 = local_38;
    uVar4 = (*local_28->_vptr_SymmetricAlgorithm[0x13])();
    if ((uVar4 & 1) != 0) {
      iVar3 = (*local_28->_vptr_SymmetricAlgorithm[0xd])();
      local_40 = CONCAT44(extraout_var_00,iVar3);
      if ((ulong)local_30 % local_40 != 0) {
        Session::resetOp(in_stack_ffffffffffffff00);
        softHSMLog(7,"SymDecryptFinal",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0xde0,
                   "Remaining data length is not an integral of the block size. Block size: %#2x  Remaining size: %#2x"
                   ,local_40,local_30);
        return 0x41;
      }
      uVar4 = (*local_28->_vptr_SymmetricAlgorithm[0xf])();
      local_48 = (long)(int)(uint)((uVar4 & 1) != 0);
      local_38 = (ByteString *)((long)local_30 - local_48);
    }
    if (local_18 == (void *)0x0) {
      *local_20 = (ulong)local_38;
      local_8 = 0;
    }
    else if ((ByteString *)*local_20 < local_38) {
      softHSMLog(7,"SymDecryptFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xdf3,"output buffer size: %#5x  size: %#5x",*local_20,local_38);
      *local_20 = (ulong)local_38;
      local_8 = 0x150;
    }
    else {
      ByteString::ByteString((ByteString *)0x16c6ff);
      uVar4 = (*local_28->_vptr_SymmetricAlgorithm[7])(local_28,local_70);
      this_00 = local_38;
      if ((uVar4 & 1) == 0) {
        Session::resetOp(in_stack_ffffffffffffff00);
        local_8 = 0x40;
      }
      else {
        uVar1 = *local_20;
        this = (Session *)ByteString::size((ByteString *)0x16c7a6);
        softHSMLog(7,"SymDecryptFinal",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0xe00,"output buffer size: %#2x  size: %#2x  decryptedFinal.size(): %#2x",uVar1)
        ;
        uVar1 = *local_20;
        sVar5 = ByteString::size((ByteString *)0x16c80b);
        if (uVar1 < sVar5) {
          Session::resetOp(this);
          uVar1 = *local_20;
          sVar5 = ByteString::size((ByteString *)0x16c851);
          softHSMLog(3,"SymDecryptFinal",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0xe07,
                     "DecryptFinal returning too much data. Length of output data buffer is %i but %i bytes was returned by the encrypt."
                     ,uVar1,sVar5);
          local_8 = 0x41;
        }
        else {
          sVar5 = ByteString::size((ByteString *)0x16c8b9);
          if (sVar5 != 0) {
            __src = ByteString::byte_str(this_00);
            sVar5 = ByteString::size((ByteString *)0x16c8f9);
            memcpy(local_18,__src,sVar5);
          }
          sVar5 = ByteString::size((ByteString *)0x16c921);
          *local_20 = sVar5;
          Session::resetOp(this);
          local_8 = 0;
        }
      }
      ByteString::~ByteString((ByteString *)0x16c96b);
    }
  }
  return local_8;
}

Assistant:

static CK_RV SymDecryptFinal(Session* session, CK_BYTE_PTR pDecryptedData, CK_ULONG_PTR pulDecryptedDataLen)
{
	SymmetricAlgorithm* cipher = session->getSymmetricCryptoOp();
	if (cipher == NULL || !session->getAllowMultiPartOp())
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Check encrypted data size
	size_t remainingSize = cipher->getBufferSize();
	CK_ULONG size = remainingSize;
	if (cipher->isBlockCipher())
	{
		size_t blockSize = cipher->getBlockSize();
		if (remainingSize % blockSize != 0)
		{
			session->resetOp();
			DEBUG_MSG("Remaining data length is not an integral of the block size. Block size: %#2x  Remaining size: %#2x",
				   blockSize, remainingSize);
			return CKR_ENCRYPTED_DATA_LEN_RANGE;
		}
		// It is at least one padding byte. If no padding the all remains will be returned.
		size_t paddingAdjustByte = cipher->getPaddingMode() ? 1 : 0;
		size = remainingSize - paddingAdjustByte;
	}

	// Give required output buffer size.
	if (pDecryptedData == NULL_PTR)
	{
		*pulDecryptedDataLen = size;
		return CKR_OK;
	}

	// Check output buffer size
	if (*pulDecryptedDataLen < size)
	{
		DEBUG_MSG("output buffer size: %#5x  size: %#5x",
			  *pulDecryptedDataLen, size);
		*pulDecryptedDataLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Finalize decryption
	ByteString decryptedFinal;
	if (!cipher->decryptFinal(decryptedFinal))
	{
		session->resetOp();
		return CKR_ENCRYPTED_DATA_INVALID;
	}
	DEBUG_MSG("output buffer size: %#2x  size: %#2x  decryptedFinal.size(): %#2x",
		  *pulDecryptedDataLen, size, decryptedFinal.size());

	// Check output size from crypto. Unrecoverable error if to large.
	if (*pulDecryptedDataLen < decryptedFinal.size())
	{
		session->resetOp();
		ERROR_MSG("DecryptFinal returning too much data. Length of output data buffer is %i but %i bytes was returned by the encrypt.",
			  *pulDecryptedDataLen, decryptedFinal.size());
		return CKR_ENCRYPTED_DATA_LEN_RANGE;
	}

	if (decryptedFinal.size() > 0)
	{
		memcpy(pDecryptedData, decryptedFinal.byte_str(), decryptedFinal.size());
	}
	*pulDecryptedDataLen = decryptedFinal.size();

	session->resetOp();
	return CKR_OK;
}